

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

png_structp set_store_for_read(png_store *ps,png_infopp ppi,png_uint_32 id,char *name)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  png_structp ppVar4;
  png_store_file *ppVar5;
  png_info *ppVar6;
  size_t pos;
  png_uint_32 id_00;
  code *pcVar7;
  ulong uVar8;
  ulong uVar9;
  exception_context *the_exception_context;
  long lVar10;
  char local_a8 [136];
  
  if ((name == (char *)0x0) || (cVar1 = *name, cVar1 == '\0')) {
    uVar3 = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      ps->test[uVar8] = cVar1;
      if (uVar8 == 0x7f) {
        uVar9 = 0x80;
        break;
      }
      cVar1 = name[uVar8 + 1];
      uVar9 = uVar8 + 1;
    } while (cVar1 != '\0');
    uVar3 = 0x7f;
    if (uVar8 < 0x7f) {
      uVar3 = uVar9;
    }
  }
  ps->test[uVar3] = '\0';
  if (ps->pread != (png_structp)0x0) {
    png_error(ps->pread,"read store already in use");
  }
  store_read_reset(ps);
  if ((ps->field_0x18 & 0x20) == 0) {
    pcVar7 = store_warning;
    ppVar4 = (png_structp)
             png_create_read_struct_2
                       ("1.6.48.git",ps,store_error,store_warning,&ps->read_memory_pool,store_malloc
                        ,store_free);
  }
  else {
    pcVar7 = store_warning;
    ppVar4 = (png_structp)png_create_read_struct("1.6.48.git",ps,store_error);
  }
  id_00 = (png_uint_32)pcVar7;
  ps->pread = ppVar4;
  if (ppVar4 == (png_structp)0x0) {
    store_log(ps,(png_const_structp)0x0,"png_create_read_struct returned NULL (unexpected)",1);
    (ps->exception_context).v.etmp = ps;
    longjmp((__jmp_buf_tag *)(ps->exception_context).penv,1);
  }
  if (0 < ps->noptions) {
    lVar10 = 0;
    do {
      iVar2 = png_set_option(ps->pread,ps->options[lVar10].option,ps->options[lVar10].setting);
      id_00 = (png_uint_32)pcVar7;
      if (iVar2 == 1) {
        png_error(ps->pread,"png option invalid");
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < ps->noptions);
  }
  ppVar5 = (png_store_file *)&ps->saved;
  do {
    ppVar5 = ppVar5->next;
    if (ppVar5 == (png_store_file *)0x0) {
      pos = standard_name_from_id(local_a8,0x80,(ulong)id,id_00);
      safecat(local_a8,0x80,pos,": file not found");
      png_error(ps->pread,local_a8);
    }
  } while (ppVar5->id != id);
  ps->current = ppVar5;
  ps->next = (png_store_buffer *)0x0;
  ps->IDAT_size = ppVar5->IDAT_size;
  ps->IDAT_bits = ppVar5->IDAT_bits;
  ps->IDAT_crc = 0;
  ps->IDAT_len = 0;
  ps->IDAT_pos = 0;
  store_read_buffer_next(ps);
  if (ppi != (png_infopp)0x0) {
    ppVar6 = (png_info *)png_create_info_struct(ps->pread);
    ps->piread = ppVar6;
    *ppi = ppVar6;
  }
  return ps->pread;
}

Assistant:

static png_structp
set_store_for_read(png_store *ps, png_infopp ppi, png_uint_32 id,
   const char *name)
{
   /* Set the name for png_error */
   safecat(ps->test, sizeof ps->test, 0, name);

   if (ps->pread != NULL)
      png_error(ps->pread, "read store already in use");

   store_read_reset(ps);

   /* Both the create APIs can return NULL if used in their default mode
    * (because there is no other way of handling an error because the jmp_buf
    * by default is stored in png_struct and that has not been allocated!)
    * However, given that store_error works correctly in these circumstances
    * we don't ever expect NULL in this program.
    */
#  ifdef PNG_USER_MEM_SUPPORTED
      if (!ps->speed)
         ps->pread = png_create_read_struct_2(PNG_LIBPNG_VER_STRING, ps,
             store_error, store_warning, &ps->read_memory_pool, store_malloc,
             store_free);

      else
#  endif
   ps->pread = png_create_read_struct(PNG_LIBPNG_VER_STRING, ps, store_error,
      store_warning);

   if (ps->pread == NULL)
   {
      struct exception_context *the_exception_context = &ps->exception_context;

      store_log(ps, NULL, "png_create_read_struct returned NULL (unexpected)",
         1 /*error*/);

      Throw ps;
   }

#  ifdef PNG_SET_OPTION_SUPPORTED
      {
         int opt;
         for (opt=0; opt<ps->noptions; ++opt)
            if (png_set_option(ps->pread, ps->options[opt].option,
               ps->options[opt].setting) == PNG_OPTION_INVALID)
                  png_error(ps->pread, "png option invalid");
      }
#  endif

   store_read_set(ps, id);

   if (ppi != NULL)
      *ppi = ps->piread = png_create_info_struct(ps->pread);

   return ps->pread;
}